

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

QMetaTypeInterface * interfaceForTypeNoWarning(int typeId)

{
  bool bVar1;
  int iVar2;
  QMetaTypeModuleHelper *pQVar3;
  undefined4 extraout_var;
  uint in_EDI;
  QMetaTypeModuleHelper *moduleHelper;
  QMetaTypeInterface *iface;
  undefined4 in_stack_00000010;
  QMetaTypeInterface *local_10;
  
  local_10 = (QMetaTypeInterface *)0x0;
  if ((int)in_EDI < 0x10000) {
    pQVar3 = qModuleHelperForType(in_EDI);
    if (pQVar3 != (QMetaTypeModuleHelper *)0x0) {
      iVar2 = (**pQVar3->_vptr_QMetaTypeModuleHelper)(pQVar3,(ulong)in_EDI);
      local_10 = (QMetaTypeInterface *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    bVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
            ::exists((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
                      *)0x38ba37);
    if (bVar1) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
      ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
                    *)0x38ba49);
      local_10 = anon_unknown.dwarf_643d2e::QMetaTypeCustomRegistry::getCustomType
                           ((QMetaTypeCustomRegistry *)CONCAT44(typeId,in_stack_00000010),
                            iface._4_4_);
    }
  }
  return local_10;
}

Assistant:

static const QtPrivate::QMetaTypeInterface *interfaceForTypeNoWarning(int typeId)
{
    const QtPrivate::QMetaTypeInterface *iface = nullptr;
    if (typeId >= QMetaType::User) {
#ifndef QT_BOOTSTRAPPED
        if (customTypeRegistry.exists())
            iface = customTypeRegistry->getCustomType(typeId);
#endif
    } else {
        if (auto moduleHelper = qModuleHelperForType(typeId))
            iface = moduleHelper->interfaceForType(typeId);
    }
    return iface;
}